

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

wchar_t object_to_dam(object *obj)

{
  wchar_t wVar1;
  object **ppoVar2;
  ulong uVar3;
  
  wVar1 = (wchar_t)obj->to_d;
  if ((obj->curses != (curse_data *)0x0) && (1 < (ulong)z_info->curse_max)) {
    ppoVar2 = &curses[1].obj;
    uVar3 = 1;
    do {
      if (obj->curses[uVar3].power != L'\0') {
        wVar1 = wVar1 + (*ppoVar2)->to_d;
      }
      uVar3 = uVar3 + 1;
      ppoVar2 = ppoVar2 + 7;
    } while (z_info->curse_max != uVar3);
  }
  return wVar1;
}

Assistant:

int object_to_dam(const struct object *obj)
{
	int result = obj->to_d;

	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; ++i) {
			if (obj->curses[i].power) {
				result += curses[i].obj->to_d;
			}
		}
	}
	return result;
}